

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O0

void __thiscall
tchecker::syncprod::syncprod_t::syncprod_t
          (syncprod_t *this,shared_ptr<const_tchecker::syncprod::system_t> *system,
          sharing_type_t sharing_type,size_t block_size,size_t table_size)

{
  element_type *peVar1;
  size_t sVar2;
  size_t table_size_local;
  size_t block_size_local;
  sharing_type_t sharing_type_local;
  shared_ptr<const_tchecker::syncprod::system_t> *system_local;
  syncprod_t *this_local;
  
  ts::
  fwd_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
  ::fwd_t(&this->
           super_fwd_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
         );
  ts::
  bwd_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
  ::bwd_t(&this->
           super_bwd_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
         );
  ts::
  fwd_impl_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::syncprod::outgoing_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t>
  ::fwd_impl_t(&this->
                super_fwd_impl_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::syncprod::outgoing_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t>
              );
  ts::
  bwd_impl_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t>
  ::bwd_impl_t(&this->
                super_bwd_impl_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t>
              );
  ts::
  builder_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
  ::builder_t(&this->
               super_builder_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
             );
  ts::
  inspector_t<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
  ::inspector_t(&this->
                 super_inspector_t<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
               );
  ts::
  sharing_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
  ::sharing_t(&this->
               super_sharing_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
             );
  (this->
  super_fwd_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
  )._vptr_fwd_t = (_func_int **)&PTR__syncprod_t_0034a6a8;
  (this->
  super_bwd_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
  )._vptr_bwd_t = (_func_int **)&PTR__syncprod_t_0034a768;
  (this->
  super_fwd_impl_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::syncprod::outgoing_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t>
  )._vptr_fwd_impl_t = (_func_int **)&PTR__syncprod_t_0034a798;
  (this->
  super_bwd_impl_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>,_tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::syncprod::incoming_edges_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::syncprod::vloc_edges_iterator_t::sync_edges_t>
  )._vptr_bwd_impl_t = (_func_int **)&PTR__syncprod_t_0034a7d8;
  (this->
  super_builder_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
  )._vptr_builder_t = (_func_int **)&PTR__syncprod_t_0034a818;
  (this->
  super_inspector_t<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
  )._vptr_inspector_t = (_func_int **)&PTR__syncprod_t_0034a840;
  (this->
  super_sharing_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>_>
  )._vptr_sharing_t = (_func_int **)&PTR__syncprod_t_0034a888;
  std::shared_ptr<const_tchecker::syncprod::system_t>::shared_ptr(&this->_system,system);
  this->_sharing_type = sharing_type;
  peVar1 = std::
           __shared_ptr_access<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_system);
  sVar2 = tchecker::system::processes_t::processes_count
                    (&(peVar1->super_system_t).super_processes_t);
  state_pool_allocator_t::state_pool_allocator_t
            (&this->_state_allocator,block_size,block_size,sVar2,table_size);
  peVar1 = std::
           __shared_ptr_access<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_system);
  sVar2 = tchecker::system::processes_t::processes_count
                    (&(peVar1->super_system_t).super_processes_t);
  transition_pool_allocator_t::transition_pool_allocator_t
            (&this->_transition_allocator,block_size,block_size,sVar2,table_size);
  return;
}

Assistant:

syncprod_t::syncprod_t(std::shared_ptr<tchecker::syncprod::system_t const> const & system,
                       enum tchecker::ts::sharing_type_t sharing_type, std::size_t block_size, std::size_t table_size)
    : _system(system), _sharing_type(sharing_type),
      _state_allocator(block_size, block_size, _system->processes_count(), table_size),
      _transition_allocator(block_size, block_size, _system->processes_count(), table_size)
{
}